

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O3

void quit_altrace_playback(void)

{
  int iVar1;
  
  iVar1 = logfd;
  logfd = -1;
  io_failure = 0;
  next_mapped_threadid = 0;
  trace_scope = 0;
  guserdata = (void *)0x0;
  fflush(_stdout);
  if (iVar1 != -1) {
    iVar1 = close(iVar1);
    if (iVar1 < 0) {
      quit_altrace_playback_cold_1();
    }
  }
  free(simplemap_device);
  simplemap_device = (SimpleMap_device *)0x0;
  simplemap_device_map_size = 0;
  free(simplemap_context);
  simplemap_context = (SimpleMap_context *)0x0;
  simplemap_context_map_size = 0;
  free_source_map();
  free_buffer_map();
  free_stackframe_map();
  free(simplemap_threadid);
  simplemap_threadid = (SimpleMap_threadid *)0x0;
  simplemap_threadid_map_size = 0;
  free_devicelabel_map();
  free_contextlabel_map();
  free_sourcelabel_map();
  free_bufferlabel_map();
  free_ioblobs();
  fflush(_stderr);
  return;
}

Assistant:

static void quit_altrace_playback(void)
{
    const int io = logfd;

    logfd = -1;
    io_failure = 0;
    next_mapped_threadid = 0;
    trace_scope = 0;
    guserdata = NULL;

    fflush(stdout);

    if ((io != -1) && (close(io) < 0)) {
        fprintf(stderr, "%s: Failed to close OpenAL log file: %s\n", GAppName, strerror(errno));
    }

    free_device_map();
    free_context_map();
    free_source_map();
    free_buffer_map();
    free_stackframe_map();
    free_threadid_map();
    free_devicelabel_map();
    free_contextlabel_map();
    free_sourcelabel_map();
    free_bufferlabel_map();
    free_ioblobs();

    fflush(stderr);
}